

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

ResourceVariableMeta __thiscall
dxil_spv::Converter::Impl::get_resource_variable_meta(Impl *this,MDNode *resource)

{
  ResourceVariableMeta RVar1;
  ResourceVariableMeta RVar2;
  MetadataKind MVar3;
  ValueKind VVar4;
  uint uVar5;
  ConstantAsMetadata *this_00;
  Constant *value;
  key_type pGVar6;
  ConstantExpr *this_01;
  size_type sVar7;
  bool bVar8;
  GlobalVariable *global;
  key_type local_28;
  
  if (resource != (MDNode *)0x0) {
    this_00 = (ConstantAsMetadata *)LLVMBC::MDNode::getOperand(resource,1);
    MVar3 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)this_00);
    RVar2.is_lib_variable = false;
    RVar2.is_active = true;
    if (MVar3 == Constant) {
      value = LLVMBC::ConstantAsMetadata::getValue(this_00);
      if (value == (Constant *)0x0) {
        local_28 = (key_type)0x0;
      }
      else {
        pGVar6 = (key_type)LLVMBC::Internal::resolve_proxy(&value->super_Value);
        VVar4 = LLVMBC::Value::get_value_kind((Value *)pGVar6);
        local_28 = (key_type)0x0;
        if (VVar4 == Global) {
          local_28 = pGVar6;
        }
      }
      bVar8 = local_28 == (key_type)0x0;
      if ((value != (Constant *)0x0) && (local_28 == (key_type)0x0)) {
        do {
          this_01 = (ConstantExpr *)LLVMBC::Internal::resolve_proxy(&value->super_Value);
          VVar4 = LLVMBC::Value::get_value_kind((Value *)this_01);
          if ((VVar4 == ConstantExpr) &&
             (uVar5 = LLVMBC::ConstantExpr::getOpcode(this_01), uVar5 == 0x70)) {
            value = LLVMBC::ConstantExpr::getOperand(this_01,0);
            if (value == (Constant *)0x0) {
              local_28 = (key_type)0x0;
            }
            else {
              pGVar6 = (key_type)LLVMBC::Internal::resolve_proxy(&value->super_Value);
              VVar4 = LLVMBC::Value::get_value_kind((Value *)pGVar6);
              local_28 = pGVar6;
              if (VVar4 != Global) {
                local_28 = (key_type)0x0;
              }
            }
          }
          else {
            value = (Constant *)0x0;
          }
          bVar8 = local_28 == (key_type)0x0;
        } while ((value != (Constant *)0x0) && (local_28 == (key_type)0x0));
      }
      RVar2.is_lib_variable = false;
      RVar2.is_active = true;
      if (!bVar8) {
        sVar7 = std::
                _Hashtable<const_LLVMBC::GlobalVariable_*,_const_LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::GlobalVariable_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::GlobalVariable_*>,_std::hash<const_LLVMBC::GlobalVariable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&(this->llvm_active_global_resource_variables)._M_h,&local_28);
        RVar2 = (ResourceVariableMeta)((ushort)(sVar7 != 0) * 0x100 + 1);
      }
    }
    return RVar2;
  }
  RVar1.is_lib_variable = false;
  RVar1.is_active = false;
  return RVar1;
}

Assistant:

Converter::Impl::ResourceVariableMeta Converter::Impl::get_resource_variable_meta(const llvm::MDNode *resource) const
{
	ResourceVariableMeta meta = {};

	if (!resource)
		return meta;

	if (const auto *variable = llvm::dyn_cast<llvm::ConstantAsMetadata>(resource->getOperand(1)))
	{
		const llvm::Value *val = variable->getValue();
		const auto *global = llvm::dyn_cast<llvm::GlobalVariable>(val);

		// It's possible that the variable is a constexpr bitcast, so resolve those ...
		while (!global && val)
		{
			auto *constexpr_op = llvm::dyn_cast<llvm::ConstantExpr>(val);
			val = nullptr;

			if (constexpr_op && constexpr_op->getOpcode() == llvm::UnaryOperator::BitCast)
			{
				val = constexpr_op->getOperand(0);
				global = llvm::dyn_cast<llvm::GlobalVariable>(val);
			}
		}

		if (global)
		{
			meta.is_lib_variable = true;
			meta.is_active = llvm_active_global_resource_variables.count(global) != 0;
			return meta;
		}
	}

	meta.is_active = true;
	return meta;
}